

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmRegisterConstant(jx9_vm *pVm,SyString *pName,ProcConstant xExpand,void *pUserData)

{
  void *pvVar1;
  SyHashEntry *pSVar2;
  undefined8 *pUserData_00;
  char *pKey;
  sxi32 rc;
  char *zDupName;
  SyHashEntry *pEntry;
  jx9_constant *pCons;
  void *pUserData_local;
  ProcConstant xExpand_local;
  SyString *pName_local;
  jx9_vm *pVm_local;
  
  pSVar2 = SyHashGet(&pVm->hConstant,pName->zString,pName->nByte);
  if (pSVar2 == (SyHashEntry *)0x0) {
    pUserData_00 = (undefined8 *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x20);
    if (pUserData_00 == (undefined8 *)0x0) {
      pVm_local._4_4_ = 0;
    }
    else {
      pKey = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte);
      if (pKey == (char *)0x0) {
        SyMemBackendPoolFree(&pVm->sAllocator,pUserData_00);
        pVm_local._4_4_ = 0;
      }
      else {
        *pUserData_00 = pKey;
        *(uint *)(pUserData_00 + 1) = pName->nByte;
        pUserData_00[2] = xExpand;
        pUserData_00[3] = pUserData;
        pVm_local._4_4_ =
             SyHashInsert(&pVm->hConstant,pKey,*(sxu32 *)(pUserData_00 + 1),pUserData_00);
        if (pVm_local._4_4_ == 0) {
          pVm_local._4_4_ = 0;
        }
        else {
          SyMemBackendFree(&pVm->sAllocator,pKey);
          SyMemBackendPoolFree(&pVm->sAllocator,pUserData_00);
        }
      }
    }
  }
  else {
    pvVar1 = pSVar2->pUserData;
    *(ProcConstant *)((long)pvVar1 + 0x10) = xExpand;
    *(void **)((long)pvVar1 + 0x18) = pUserData;
    pVm_local._4_4_ = 0;
  }
  return pVm_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmRegisterConstant(
	jx9_vm *pVm,            /* Target VM */
	const SyString *pName,  /* Constant name */
	ProcConstant xExpand,   /* Constant expansion callback */
	void *pUserData         /* Last argument to xExpand() */
	)
{
	jx9_constant *pCons;
	SyHashEntry *pEntry;
	char *zDupName;
	sxi32 rc;
	pEntry = SyHashGet(&pVm->hConstant, (const void *)pName->zString, pName->nByte);
	if( pEntry ){
		/* Overwrite the old definition and return immediately */
		pCons = (jx9_constant *)pEntry->pUserData;
		pCons->xExpand = xExpand;
		pCons->pUserData = pUserData;
		return SXRET_OK;
	}
	/* Allocate a new constant instance */
	pCons = (jx9_constant *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_constant));
	if( pCons == 0 ){
		return 0;
	}
	/* Duplicate constant name */
	zDupName = SyMemBackendStrDup(&pVm->sAllocator, pName->zString, pName->nByte);
	if( zDupName == 0 ){
		SyMemBackendPoolFree(&pVm->sAllocator, pCons);
		return 0;
	}
	/* Install the constant */
	SyStringInitFromBuf(&pCons->sName, zDupName, pName->nByte);
	pCons->xExpand = xExpand;
	pCons->pUserData = pUserData;
	rc = SyHashInsert(&pVm->hConstant, (const void *)zDupName, SyStringLength(&pCons->sName), pCons);
	if( rc != SXRET_OK ){
		SyMemBackendFree(&pVm->sAllocator, zDupName);
		SyMemBackendPoolFree(&pVm->sAllocator, pCons);
		return rc;
	}
	/* All done, constant can be invoked from JX9 code */
	return SXRET_OK;
}